

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trees.c
# Opt level: O2

void pqdownheap(deflate_state *s,ct_data *tree,int k)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  long lVar4;
  uint uVar5;
  
  iVar1 = s->heap[(uint)k];
  while( true ) {
    uVar3 = k * 2;
    if (s->heap_len < (int)uVar3) break;
    if ((int)uVar3 < s->heap_len) {
      uVar5 = uVar3 | 1;
      lVar4 = (long)(int)uVar3;
      if ((tree[s->heap[(int)uVar5]].fc.freq < tree[s->heap[lVar4]].fc.freq) ||
         ((tree[s->heap[(int)uVar5]].fc.freq == tree[s->heap[lVar4]].fc.freq &&
          (s->depth[s->heap[(int)uVar5]] <= s->depth[s->heap[lVar4]])))) {
        lVar4 = (long)(int)uVar5;
        uVar3 = uVar5;
      }
    }
    else {
      lVar4 = (long)(int)uVar3;
    }
    iVar2 = s->heap[lVar4];
    if ((tree[iVar1].fc.freq < tree[iVar2].fc.freq) ||
       ((tree[iVar1].fc.freq == tree[iVar2].fc.freq && (s->depth[iVar1] <= s->depth[iVar2]))))
    break;
    s->heap[k] = iVar2;
    k = uVar3;
  }
  s->heap[k] = iVar1;
  return;
}

Assistant:

static void pqdownheap(deflate_state *s, ct_data *tree, int k) {
    /* tree: the tree to restore */
    /* k: node to move down */
    int v = s->heap[k];
    int j = k << 1;  /* left son of k */
    while (j <= s->heap_len) {
        /* Set j to the smallest of the two sons: */
        if (j < s->heap_len && smaller(tree, s->heap[j+1], s->heap[j], s->depth)) {
            j++;
        }
        /* Exit if v is smaller than both sons */
        if (smaller(tree, v, s->heap[j], s->depth))
            break;

        /* Exchange v with the smallest son */
        s->heap[k] = s->heap[j];
        k = j;

        /* And continue down the tree, setting j to the left son of k */
        j <<= 1;
    }
    s->heap[k] = v;
}